

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mu_test.c
# Opt level: O0

void attempt_rtrylock(testing t,char *id,int verbose,nsync_mu *mu,int expected_acquire,int release,
                     int *value,int expected_value,counter *done)

{
  uint uVar1;
  char *pcVar2;
  int acquired;
  int release_local;
  int expected_acquire_local;
  nsync_mu *mu_local;
  int verbose_local;
  char *id_local;
  testing t_local;
  
  uVar1 = nsync::nsync_mu_rtrylock(mu);
  if (uVar1 != expected_acquire) {
    pcVar2 = smprintf("attempt_rtrylock %s: expected nsync_mu_rtrylock() to return %d but got %d",id
                      ,(ulong)(uint)expected_acquire,(ulong)uVar1);
    testing_panic(pcVar2);
  }
  if (verbose != 0) {
    pcVar2 = smprintf("attempt_rtrylock %s %d\n",id,(ulong)uVar1);
    testing_error_(t,0,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/build_O0/cpp/testing/mu_test.c"
                   ,0x17e,pcVar2);
  }
  if (uVar1 != 0) {
    nsync::nsync_mu_rassert_held(mu);
    if ((expected_value != -1) && (*value != expected_value)) {
      pcVar2 = smprintf("attempt_rtrylock %s expected value %d, *value=%d",id,
                        (ulong)(uint)expected_value,(ulong)(uint)*value);
      testing_panic(pcVar2);
    }
    if (release != 0) {
      nsync::nsync_mu_runlock(mu);
    }
  }
  counter_inc(done,-1);
  return;
}

Assistant:

static void attempt_rtrylock (testing t, const char *id, int verbose,
			      nsync_mu *mu, int expected_acquire, int release,
			      int *value, int expected_value, counter *done) {
	int acquired = nsync_mu_rtrylock (mu);
	if (acquired != expected_acquire) {
		testing_panic (smprintf ("attempt_rtrylock %s: expected "
					 "nsync_mu_rtrylock() to return %d but got %d",
					 id, expected_acquire, acquired));
	}
	if (verbose) {
		TEST_LOG (t, ("attempt_rtrylock %s %d\n", id, acquired));
	}
	if (acquired) {
		nsync_mu_rassert_held (mu);
		if (expected_value != -1 && *value != expected_value) {
			testing_panic (smprintf ("attempt_rtrylock %s expected "
						 "value %d, *value=%d",
						 id, expected_value, *value));
		}
		if (release) {
			nsync_mu_runlock (mu);
		}
	}
	counter_inc (done, -1);
}